

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

CubeFace tcu::selectCubeFace(Vec3 *coords)

{
  float x_00;
  float x_01;
  float x_02;
  float fVar1;
  float fVar2;
  float fVar3;
  float az;
  float ay;
  float ax;
  float z;
  float y;
  float x;
  Vec3 *coords_local;
  
  x_00 = Vector<float,_3>::x(coords);
  x_01 = Vector<float,_3>::y(coords);
  x_02 = Vector<float,_3>::z(coords);
  fVar1 = deFloatAbs(x_00);
  fVar2 = deFloatAbs(x_01);
  fVar3 = deFloatAbs(x_02);
  if ((fVar1 <= fVar2) || (fVar1 <= fVar3)) {
    if ((fVar2 <= fVar1) || (fVar2 <= fVar3)) {
      if ((fVar3 <= fVar1) || (fVar3 <= fVar2)) {
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          if ((fVar1 != fVar3) || (NAN(fVar1) || NAN(fVar3))) {
            if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
              coords_local._4_4_ = (CubeFace)(0.0 <= x_00);
            }
            else if (fVar1 <= fVar2) {
              coords_local._4_4_ = CUBEFACE_NEGATIVE_Y;
              if (0.0 <= x_01) {
                coords_local._4_4_ = CUBEFACE_POSITIVE_Y;
              }
            }
            else {
              coords_local._4_4_ = (CubeFace)(0.0 <= x_00);
            }
          }
          else if (fVar2 <= fVar3) {
            coords_local._4_4_ = CUBEFACE_NEGATIVE_Z;
            if (0.0 <= x_02) {
              coords_local._4_4_ = CUBEFACE_POSITIVE_Z;
            }
          }
          else {
            coords_local._4_4_ = CUBEFACE_NEGATIVE_Y;
            if (0.0 <= x_01) {
              coords_local._4_4_ = CUBEFACE_POSITIVE_Y;
            }
          }
        }
        else if (fVar3 <= fVar1) {
          coords_local._4_4_ = (CubeFace)(0.0 <= x_00);
        }
        else {
          coords_local._4_4_ = CUBEFACE_NEGATIVE_Z;
          if (0.0 <= x_02) {
            coords_local._4_4_ = CUBEFACE_POSITIVE_Z;
          }
        }
      }
      else {
        coords_local._4_4_ = CUBEFACE_NEGATIVE_Z;
        if (0.0 <= x_02) {
          coords_local._4_4_ = CUBEFACE_POSITIVE_Z;
        }
      }
    }
    else {
      coords_local._4_4_ = CUBEFACE_NEGATIVE_Y;
      if (0.0 <= x_01) {
        coords_local._4_4_ = CUBEFACE_POSITIVE_Y;
      }
    }
  }
  else {
    coords_local._4_4_ = (CubeFace)(0.0 <= x_00);
  }
  return coords_local._4_4_;
}

Assistant:

CubeFace selectCubeFace (const Vec3& coords)
{
	const float	x	= coords.x();
	const float	y	= coords.y();
	const float	z	= coords.z();
	const float	ax	= deFloatAbs(x);
	const float	ay	= deFloatAbs(y);
	const float	az	= deFloatAbs(z);

	if (ay < ax && az < ax)
		return x >= 0.0f ? CUBEFACE_POSITIVE_X : CUBEFACE_NEGATIVE_X;
	else if (ax < ay && az < ay)
		return y >= 0.0f ? CUBEFACE_POSITIVE_Y : CUBEFACE_NEGATIVE_Y;
	else if (ax < az && ay < az)
		return z >= 0.0f ? CUBEFACE_POSITIVE_Z : CUBEFACE_NEGATIVE_Z;
	else
	{
		// Some of the components are equal. Use tie-breaking rule.
		if (ax == ay)
		{
			if (ax < az)
				return z >= 0.0f ? CUBEFACE_POSITIVE_Z : CUBEFACE_NEGATIVE_Z;
			else
				return x >= 0.0f ? CUBEFACE_POSITIVE_X : CUBEFACE_NEGATIVE_X;
		}
		else if (ax == az)
		{
			if (az < ay)
				return y >= 0.0f ? CUBEFACE_POSITIVE_Y : CUBEFACE_NEGATIVE_Y;
			else
				return z >= 0.0f ? CUBEFACE_POSITIVE_Z : CUBEFACE_NEGATIVE_Z;
		}
		else if (ay == az)
		{
			if (ay < ax)
				return x >= 0.0f ? CUBEFACE_POSITIVE_X : CUBEFACE_NEGATIVE_X;
			else
				return y >= 0.0f ? CUBEFACE_POSITIVE_Y : CUBEFACE_NEGATIVE_Y;
		}
		else
			return x >= 0.0f ? CUBEFACE_POSITIVE_X : CUBEFACE_NEGATIVE_X;
	}
}